

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Set_irreg_distr(int g_a,int *map,int *block)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  Integer _ga_work [7];
  Integer aIStack_58 [8];
  
  IVar1 = pnga_get_dimension((long)g_a);
  lVar3 = 0;
  lVar4 = 0;
  if (0 < IVar1) {
    lVar4 = IVar1;
  }
  pIVar2 = aIStack_58 + IVar1;
  for (; pIVar2 = pIVar2 + -1, lVar4 != lVar3; lVar3 = lVar3 + 1) {
    *pIVar2 = (long)block[lVar3];
  }
  pIVar2 = copy_map(block,(int)IVar1,map);
  pnga_set_irreg_distr((long)g_a,pIVar2,aIStack_58);
  free(pIVar2);
  return;
}

Assistant:

void NGA_Set_irreg_distr(int g_a, int map[], int block[])
{
    Integer aa, ndim;
    Integer _ga_work[MAXDIM];
    Integer *_ga_map_capi;

    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_ga_work, ndim);
    _ga_map_capi = copy_map(block, (int)ndim, map);

    wnga_set_irreg_distr(aa, _ga_map_capi, _ga_work);
    free(_ga_map_capi);
}